

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O0

void __thiscall soul::TaskThread::Queue::addTask(Queue *this,TaskFunction *task)

{
  lock_guard<std::mutex> __x;
  __int_type _Var1;
  pointer this_00;
  unique_ptr<soul::TaskThread::Queue::TaskHolder,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>
  local_30;
  __single_object taskHolder;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> l;
  TaskFunction *task_local;
  Queue *this_local;
  
  l._M_device = (mutex_type *)task;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->taskListLock);
  _Var1 = std::__atomic_base::operator_cast_to_int
                    ((__atomic_base *)&this->ownerThread->shuttingDown);
  if (_Var1 == 0) {
    std::make_unique<soul::TaskThread::Queue::TaskHolder>();
    __x = l;
    this_00 = std::
              unique_ptr<soul::TaskThread::Queue::TaskHolder,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>
              ::operator->(&local_30);
    std::function<void_(std::atomic<int>_&)>::operator=
              (&this_00->function,(function<void_(std::atomic<int>_&)> *)__x._M_device);
    std::
    vector<std::unique_ptr<soul::TaskThread::Queue::TaskHolder,std::default_delete<soul::TaskThread::Queue::TaskHolder>>,std::allocator<std::unique_ptr<soul::TaskThread::Queue::TaskHolder,std::default_delete<soul::TaskThread::Queue::TaskHolder>>>>
    ::
    emplace_back<std::unique_ptr<soul::TaskThread::Queue::TaskHolder,std::default_delete<soul::TaskThread::Queue::TaskHolder>>>
              ((vector<std::unique_ptr<soul::TaskThread::Queue::TaskHolder,std::default_delete<soul::TaskThread::Queue::TaskHolder>>,std::allocator<std::unique_ptr<soul::TaskThread::Queue::TaskHolder,std::default_delete<soul::TaskThread::Queue::TaskHolder>>>>
                *)&this->tasks,&local_30);
    std::condition_variable::notify_all();
    std::
    unique_ptr<soul::TaskThread::Queue::TaskHolder,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>
    ::~unique_ptr(&local_30);
  }
  taskHolder._M_t.
  super___uniq_ptr_impl<soul::TaskThread::Queue::TaskHolder,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>
  ._M_t.
  super__Tuple_impl<0UL,_soul::TaskThread::Queue::TaskHolder_*,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>
  .super__Head_base<0UL,_soul::TaskThread::Queue::TaskHolder_*,_false>._M_head_impl._5_3_ = 0;
  taskHolder._M_t.
  super___uniq_ptr_impl<soul::TaskThread::Queue::TaskHolder,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>
  ._M_t.
  super__Tuple_impl<0UL,_soul::TaskThread::Queue::TaskHolder_*,_std::default_delete<soul::TaskThread::Queue::TaskHolder>_>
  .super__Head_base<0UL,_soul::TaskThread::Queue::TaskHolder_*,_false>._M_head_impl._4_1_ =
       _Var1 != 0;
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void addTask (TaskFunction&& task)
        {
            std::lock_guard<std::mutex> l (taskListLock);

            if (ownerThread.shuttingDown)
                return;

            auto taskHolder = std::make_unique<TaskHolder>();
            taskHolder->function = std::move (task);
            tasks.emplace_back (std::move (taskHolder));
            ownerThread.checkQueues.notify_all();
        }